

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_sign_helper
              (secp256k1_scalar *sigs,secp256k1_scalar *message,secp256k1_scalar *k,secp256k1_ge *r,
              secp256k1_scalar *sk)

{
  int iVar1;
  undefined1 local_78 [8];
  secp256k1_scalar n;
  secp256k1_scalar sigr;
  secp256k1_scalar *sk_local;
  secp256k1_ge *r_local;
  secp256k1_scalar *k_local;
  secp256k1_scalar *message_local;
  secp256k1_scalar *sigs_local;
  
  secp256k1_fe_normalize(&r->x);
  iVar1 = secp256k1_ecdsa_adaptor_fe_to_scalar((secp256k1_scalar *)(n.d + 3),&r->x);
  if (iVar1 == 0) {
    sigs_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_mul((secp256k1_scalar *)local_78,(secp256k1_scalar *)(n.d + 3),sk);
    secp256k1_scalar_add((secp256k1_scalar *)local_78,(secp256k1_scalar *)local_78,message);
    secp256k1_scalar_inverse(sigs,k);
    secp256k1_scalar_mul(sigs,sigs,(secp256k1_scalar *)local_78);
    secp256k1_scalar_clear((secp256k1_scalar *)local_78);
    iVar1 = secp256k1_scalar_is_zero(sigs);
    sigs_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  return sigs_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_adaptor_sign_helper(secp256k1_scalar *sigs, secp256k1_scalar *message, secp256k1_scalar *k, secp256k1_ge *r, secp256k1_scalar *sk) {
    secp256k1_scalar sigr;
    secp256k1_scalar n;

    secp256k1_fe_normalize(&r->x);
    if (!secp256k1_ecdsa_adaptor_fe_to_scalar(&sigr, &r->x)) {
        return 0;
    }
    secp256k1_scalar_mul(&n, &sigr, sk);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, k);
    secp256k1_scalar_mul(sigs, sigs, &n);

    secp256k1_scalar_clear(&n);
    return !secp256k1_scalar_is_zero(sigs);
}